

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractSyntaxTree.cpp
# Opt level: O0

void __thiscall MyCompiler::Condition::Condition(Condition *this)

{
  allocator local_31;
  string local_30 [32];
  Condition *local_10;
  Condition *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Condition",&local_31);
  AbstractAstNode::AbstractAstNode(&this->super_AbstractAstNode,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::shared_ptr<MyCompiler::Expression>::shared_ptr(&this->pExpression1);
  std::shared_ptr<MyCompiler::RelOp>::shared_ptr(&this->pRelOp);
  std::shared_ptr<MyCompiler::Expression>::shared_ptr(&this->pExpression2);
  return;
}

Assistant:

MyCompiler::Condition::Condition()
        : AbstractAstNode("Condition")
{}